

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fb.h
# Opt level: O2

void fb_set_range(fb_group_t *fb,size_t nbits,size_t start,size_t cnt)

{
  uint uVar1;
  ulong *puVar2;
  ulong uVar3;
  size_t sVar4;
  
  uVar1 = (uint)nbits & 0x3f;
  sVar4 = 0x40 - (ulong)uVar1;
  if (uVar1 + start < 0x41) {
    sVar4 = start;
  }
  puVar2 = fb + (nbits >> 6);
  *puVar2 = *puVar2 | (0xffffffffffffffffU >> (-(char)sVar4 & 0x3fU)) << (sbyte)uVar1;
  for (uVar3 = start - sVar4; puVar2 = puVar2 + 1, 0x40 < uVar3; uVar3 = uVar3 - 0x40) {
    *puVar2 = 0xffffffffffffffff;
  }
  if (uVar3 != 0) {
    *puVar2 = *puVar2 | 0xffffffffffffffffU >> (-(char)uVar3 & 0x3fU);
  }
  return;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void
fb_visit_impl(fb_group_t *fb, size_t nbits, fb_group_visitor_t visit, void *ctx,
    size_t start, size_t cnt) {
	assert(cnt > 0);
	assert(start + cnt <= nbits);
	size_t group_ind = start / FB_GROUP_BITS;
	size_t start_bit_ind = start % FB_GROUP_BITS;
	/*
	 * The first group is special; it's the only one we don't start writing
	 * to from bit 0.
	 */
	size_t first_group_cnt = (start_bit_ind + cnt > FB_GROUP_BITS
		? FB_GROUP_BITS - start_bit_ind : cnt);
	/*
	 * We can basically split affected words into:
	 *   - The first group, where we touch only the high bits
	 *   - The last group, where we touch only the low bits
	 *   - The middle, where we set all the bits to the same thing.
	 * We treat each case individually.  The last two could be merged, but
	 * this can lead to bad codegen for those middle words.
	 */
	/* First group */
	fb_group_t mask = ((~(fb_group_t)0)
	    >> (FB_GROUP_BITS - first_group_cnt))
	    << start_bit_ind;
	visit(ctx, &fb[group_ind], mask);

	cnt -= first_group_cnt;
	group_ind++;
	/* Middle groups */
	while (cnt > FB_GROUP_BITS) {
		visit(ctx, &fb[group_ind], ~(fb_group_t)0);
		cnt -= FB_GROUP_BITS;
		group_ind++;
	}
	/* Last group */
	if (cnt != 0) {
		mask = (~(fb_group_t)0) >> (FB_GROUP_BITS - cnt);
		visit(ctx, &fb[group_ind], mask);
	}
}